

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testobject.cpp
# Opt level: O0

Sub_Object __thiscall Sub_Object::Narrow(Sub_Object *this,Am_Object *object)

{
  int iVar1;
  Am_Value *pAVar2;
  Am_Wrapper *in_data;
  undefined8 local_30;
  undefined1 local_28 [8];
  Am_Value value;
  Am_Object *object_local;
  
  value.value = (anon_union_8_8_ea4c8939_for_value)object;
  pAVar2 = (Am_Value *)Am_Object::Get((ushort)object,10000);
  Am_Value::Am_Value((Am_Value *)local_28,pAVar2);
  if (local_28._0_2_ == 2) {
    iVar1 = Am_Value::operator_cast_to_int((Am_Value *)local_28);
    if (iVar1 == 0x2a) {
      in_data = (Am_Wrapper *)Am_Object::operator_cast_to_Am_Wrapper_(object);
      Sub_Object(this,in_data);
      Am_Value::~Am_Value((Am_Value *)local_28);
      return (Sub_Object)(Am_Object)this;
    }
  }
  Am_Error("** All hell breaks loose\n");
  _Unwind_Resume(local_30);
}

Assistant:

static Sub_Object Narrow(Am_Object object)
  {
    Am_Value value = object.Get(LEFT);
    if ((value.type == Am_INT) && ((int)value == 42))
      return (Sub_Object)(Am_Wrapper *)object; // two casts needed because
                                               // no constructor for Am_Object
    else {
      Am_Error("** All hell breaks loose\n");
      return (Sub_Object)(Am_Wrapper *)Am_No_Object;
    }
  }